

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O1

void wait_n_cv_ping_pong(ping_pong *pp,int parity)

{
  uint uVar1;
  nsync_time abs_deadline;
  nsync_waitable_s *pwaitable;
  nsync_waitable_s waitable;
  nsync_waitable_s *local_58;
  __syscall_slong_t local_50;
  nsync_cv *local_48;
  nsync_waitable_s local_40;
  
  local_58 = &local_40;
  local_40.v = pp->cv + parity;
  local_40.funcs = &nsync_cv_waitable_funcs;
  nsync_mu_lock(&pp->mu);
  if (pp->i < pp->limit) {
    local_50 = 999999999;
    local_48 = pp->cv + (1 - parity);
    do {
      uVar1 = pp->i;
      while ((uVar1 & 1) == parity) {
        abs_deadline.tv_nsec = 999999999;
        abs_deadline.tv_sec = 0x7fffffffffffffff;
        nsync_wait_n(pp,nsync_mu_lock,nsync_mu_unlock,abs_deadline,1,&local_58);
        uVar1 = pp->i;
      }
      pp->i = uVar1 + 1;
      nsync_cv_signal(local_48);
    } while (pp->i < pp->limit);
  }
  nsync_mu_unlock(&pp->mu);
  ping_pong_done(pp);
  return;
}

Assistant:

static void wait_n_cv_ping_pong (ping_pong *pp, int parity) {
	struct nsync_waitable_s waitable;
	struct nsync_waitable_s *pwaitable = &waitable;
	waitable.v = &pp->cv[parity];
	waitable.funcs = &nsync_cv_waitable_funcs;
	nsync_mu_lock (&pp->mu);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_wait_n (&pp->mu, (void (*) (void *)) &nsync_mu_lock,
				      (void (*) (void *)) &nsync_mu_unlock,
				      nsync_time_no_deadline, 1, &pwaitable);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1 - parity]);
	}
	nsync_mu_unlock (&pp->mu);
	ping_pong_done (pp);
}